

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O3

void __thiscall GuillotineBinPack::MergeFreeList(GuillotineBinPack *this)

{
  Rect *pRVar1;
  Rect *__dest;
  int iVar2;
  int iVar3;
  int iVar4;
  Rect *pRVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  DisjointRectCollection test;
  TArray<Rect,_Rect> local_38;
  
  local_38.Array = (Rect *)0x0;
  local_38.Most = 0;
  local_38.Count = 0;
  bVar14 = true;
  if ((this->freeRectangles).Count != 0) {
    lVar13 = 0;
    uVar11 = 0;
    do {
      bVar6 = DisjointRectCollection::Add
                        ((DisjointRectCollection *)&local_38,
                         (Rect *)((long)&((this->freeRectangles).Array)->x + lVar13));
      if (!bVar6) {
        __assert_fail("test.Add(freeRectangles[i]) == true",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                      ,0x254,"void GuillotineBinPack::MergeFreeList()");
      }
      uVar11 = uVar11 + 1;
      uVar9 = (this->freeRectangles).Count;
      uVar8 = (ulong)uVar9;
      lVar13 = lVar13 + 0x10;
    } while (uVar11 < uVar8);
    if (uVar9 != 0) {
      uVar11 = 0;
      do {
        uVar12 = uVar11 + 1;
        if (uVar12 < uVar8) {
          uVar10 = uVar12 & 0xffffffff;
          do {
            pRVar5 = (this->freeRectangles).Array;
            pRVar1 = pRVar5 + uVar11;
            iVar2 = pRVar5[uVar11].width;
            uVar9 = (uint)uVar10;
            __dest = pRVar5 + uVar10;
            iVar3 = pRVar5[uVar10].width;
            if ((iVar2 == iVar3) && (pRVar1->x == __dest->x)) {
              iVar2 = pRVar1->y;
              iVar3 = __dest->height;
              if (iVar2 == iVar3 + __dest->y) {
                pRVar1->y = iVar2 - iVar3;
                pRVar1->height = pRVar1->height + iVar3;
              }
              else {
                if (iVar2 + pRVar1->height != __dest->y) goto LAB_00300bf5;
                pRVar1->height = pRVar1->height + iVar3;
              }
LAB_00300bd5:
              uVar7 = (int)uVar8 - 1;
              (this->freeRectangles).Count = uVar7;
              if (uVar9 <= uVar7 && uVar7 - uVar9 != 0) {
                memmove(__dest,pRVar5 + uVar10 + 1,(ulong)(uVar7 - uVar9) << 4);
              }
              uVar9 = uVar9 - 1;
            }
            else if ((pRVar1->height == __dest->height) && (pRVar1->y == __dest->y)) {
              iVar4 = pRVar1->x;
              if (iVar4 == __dest->x + iVar3) {
                pRVar1->x = iVar4 - iVar3;
                pRVar1->width = iVar2 + iVar3;
              }
              else {
                if (iVar4 + iVar2 != __dest->x) goto LAB_00300bf5;
                pRVar1->width = iVar3 + iVar2;
              }
              goto LAB_00300bd5;
            }
LAB_00300bf5:
            uVar10 = (ulong)(uVar9 + 1);
            uVar7 = (this->freeRectangles).Count;
            uVar8 = (ulong)uVar7;
          } while (uVar9 + 1 < uVar7);
        }
        uVar11 = uVar12;
      } while (uVar12 < uVar8);
      bVar14 = (int)uVar8 == 0;
    }
  }
  if (local_38.Count != 0) {
    local_38._8_8_ = local_38._8_8_ & 0xffffffff;
  }
  if (!bVar14) {
    lVar13 = 0;
    uVar11 = 0;
    do {
      bVar14 = DisjointRectCollection::Add
                         ((DisjointRectCollection *)&local_38,
                          (Rect *)((long)&((this->freeRectangles).Array)->x + lVar13));
      if (!bVar14) {
        __assert_fail("test.Add(freeRectangles[i]) == true",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                      ,0x281,"void GuillotineBinPack::MergeFreeList()");
      }
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar11 < (this->freeRectangles).Count);
  }
  TArray<Rect,_Rect>::~TArray(&local_38);
  return;
}

Assistant:

void GuillotineBinPack::MergeFreeList()
{
#ifdef _DEBUG
	DisjointRectCollection test;
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		assert(test.Add(freeRectangles[i]) == true);
#endif

	// Do a Theta(n^2) loop to see if any pair of free rectangles could me merged into one.
	// Note that we miss any opportunities to merge three rectangles into one. (should call this function again to detect that)
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		for(unsigned j = i+1; j < freeRectangles.Size(); ++j)
		{
			if (freeRectangles[i].width == freeRectangles[j].width && freeRectangles[i].x == freeRectangles[j].x)
			{
				if (freeRectangles[i].y == freeRectangles[j].y + freeRectangles[j].height)
				{
					freeRectangles[i].y -= freeRectangles[j].height;
					freeRectangles[i].height += freeRectangles[j].height;
					freeRectangles.Delete(j);
					--j;
				}
				else if (freeRectangles[i].y + freeRectangles[i].height == freeRectangles[j].y)
				{
					freeRectangles[i].height += freeRectangles[j].height;
					freeRectangles.Delete(j);
					--j;
				}
			}
			else if (freeRectangles[i].height == freeRectangles[j].height && freeRectangles[i].y == freeRectangles[j].y)
			{
				if (freeRectangles[i].x == freeRectangles[j].x + freeRectangles[j].width)
				{
					freeRectangles[i].x -= freeRectangles[j].width;
					freeRectangles[i].width += freeRectangles[j].width;
					freeRectangles.Delete(j);
					--j;
				}
				else if (freeRectangles[i].x + freeRectangles[i].width == freeRectangles[j].x)
				{
					freeRectangles[i].width += freeRectangles[j].width;
					freeRectangles.Delete(j);
					--j;
				}
			}
		}

#ifdef _DEBUG
	test.Clear();
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		assert(test.Add(freeRectangles[i]) == true);
#endif
}